

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptor::CopyHeadingTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  byte *pbVar1;
  Edition value;
  pointer pcVar2;
  size_type sVar3;
  FeatureSet *from;
  bool bVar4;
  FileOptions *this_00;
  FileOptions *pFVar5;
  FeatureSet *this_01;
  Arena *pAVar6;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  
  pcVar2 = (this->name_->_M_dataplus)._M_p;
  sVar3 = this->name_->_M_string_length;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_00._M_str = pcVar2;
  value_00._M_len = sVar3;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value_00,pAVar6);
  sVar3 = this->package_->_M_string_length;
  if (sVar3 != 0) {
    pcVar2 = (this->package_->_M_dataplus)._M_p;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    value_01._M_str = pcVar2;
    value_01._M_len = sVar3;
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.package_,value_01,pAVar6);
  }
  if (this->edition_ == EDITION_PROTO3) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    value_02._M_str = "proto3";
    value_02._M_len = 6;
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.syntax_,value_02,pAVar6);
  }
  else if (999 < (int)this->edition_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    value_03._M_str = "editions";
    value_03._M_len = 8;
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.syntax_,value_03,pAVar6);
    value = this->edition_;
    bVar4 = internal::ValidateEnum(value,(uint32_t *)Edition_internal_data_);
    if (!bVar4) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x34a2,
                    "void google::protobuf::FileDescriptorProto::_internal_set_edition(::google::protobuf::Edition)"
                   );
    }
    (proto->field_0)._impl_.edition_ = value;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x20;
  }
  pFVar5 = this->options_;
  if (pFVar5 != (FileOptions *)_FileOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 8;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (FileOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      this_00 = (FileOptions *)Arena::DefaultConstruct<google::protobuf::FileOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = this_00;
    }
    FileOptions::CopyFrom(this_00,pFVar5);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 8;
    pFVar5 = (proto->field_0)._impl_.options_;
    if (pFVar5 == (FileOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pFVar5 = (FileOptions *)Arena::DefaultConstruct<google::protobuf::FileOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = pFVar5;
    }
    pbVar1 = (byte *)((long)&pFVar5->field_0 + 0x19);
    *pbVar1 = *pbVar1 | 4;
    this_01 = (pFVar5->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar6 = (Arena *)(pFVar5->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar6);
      (pFVar5->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyHeadingTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) {
    proto->set_package(package());
  }

  if (edition() == Edition::EDITION_PROTO3) {
    proto->set_syntax("proto3");
  } else if (!IsLegacyEdition(edition())) {
    proto->set_syntax("editions");
    proto->set_edition(edition());
  }

  if (&options() != &FileOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}